

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

stbi_uc * stbi__resample_row_generic(stbi_uc *out,stbi_uc *in_near,stbi_uc *in_far,int w,int hs)

{
  stbi_uc sVar1;
  stbi_uc *psVar2;
  ulong uVar3;
  ulong uVar4;
  
  psVar2 = out;
  if (0 < w) {
    uVar3 = 0;
    do {
      if (0 < hs) {
        sVar1 = in_near[uVar3];
        uVar4 = 0;
        do {
          out[uVar4] = sVar1;
          uVar4 = uVar4 + 1;
        } while ((uint)hs != uVar4);
      }
      uVar3 = uVar3 + 1;
      out = out + (uint)hs;
    } while (uVar3 != (uint)w);
  }
  return psVar2;
}

Assistant:

static stbi_uc *stbi__resample_row_generic(stbi_uc *out, stbi_uc *in_near, stbi_uc *in_far, int w, int hs)
{
   // resample with nearest-neighbor
   int i,j;
   STBI_NOTUSED(in_far);
   for (i=0; i < w; ++i)
      for (j=0; j < hs; ++j)
         out[i*hs+j] = in_near[i];
   return out;
}